

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::renderMultisampledImage
               (Context *context,CaseDef *caseDef,VkImage colorImage)

{
  allocator<vk::VkClearValue> *this;
  VkFormat format;
  int iVar1;
  VkPipelineLayout pipelineLayout_00;
  VkRenderPass renderPass_00;
  VkShaderModule vertexModule_00;
  VkShaderModule fragmentModule_00;
  VkCommandBuffer_s *pVVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkImageSubresourceRange subresourceRange;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)17>_> data_05;
  RefData<vk::Handle<(vk::HandleType)23>_> data_06;
  RefData<vk::Handle<(vk::HandleType)16>_> data_07;
  VkAllocationCallbacks *allocator_00;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 height;
  VkResult result;
  MovePtr *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Handle<(vk::HandleType)24> *pHVar5;
  VkOffset2D VVar6;
  VkExtent2D VVar7;
  reference this_00;
  RefBase<vk::Handle<(vk::HandleType)13>_> *this_01;
  Handle<(vk::HandleType)13> *__x;
  Handle<(vk::HandleType)8> *pHVar8;
  Allocation *pAVar9;
  void *dst;
  const_reference src;
  VkDeviceSize offset;
  ProgramCollection<vk::ProgramBinary> *pPVar10;
  ProgramBinary *pPVar11;
  Handle<(vk::HandleType)17> *pHVar12;
  reference pAttachments;
  Handle<(vk::HandleType)16> *pHVar13;
  Handle<(vk::HandleType)14> *pHVar14;
  VkCommandBuffer_s **ppVVar15;
  Handle<(vk::HandleType)23> *pHVar16;
  size_type sVar17;
  const_reference this_02;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_03;
  Handle<(vk::HandleType)18> *pHVar18;
  MovePtr *this_04;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int local_574;
  undefined8 uStack_570;
  int layerNdx;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue local_520;
  undefined1 local_510 [8];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  undefined1 local_4d0 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  RefData<vk::Handle<(vk::HandleType)16>_> local_498;
  undefined1 local_478 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_450;
  RefData<vk::Handle<(vk::HandleType)23>_> local_430;
  undefined1 local_410 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_3d0;
  undefined1 local_3b0 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  string local_388;
  Move<vk::Handle<(vk::HandleType)14>_> local_368;
  RefData<vk::Handle<(vk::HandleType)14>_> local_348;
  undefined1 local_328 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_300;
  Move<vk::Handle<(vk::HandleType)14>_> local_2e0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_2c0;
  undefined1 local_2a0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_268;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_258;
  undefined1 local_248 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_218;
  undefined1 local_1f8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  VkDeviceSize vertexBufferSize;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  undefined8 uStack_1b0;
  deUint32 local_1a8;
  Move<vk::Handle<(vk::HandleType)13>_> local_198;
  value_type local_178;
  int local_164;
  undefined1 local_160 [4];
  int i;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  VkRect2D renderArea;
  Move<vk::VkCommandBuffer_s_*> local_118;
  RefData<vk::VkCommandBuffer_s_*> local_f8;
  undefined1 local_d8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  CaseDef *caseDef_local;
  Context *context_local;
  VkImage colorImage_local;
  
  vk_00 = (MovePtr *)Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getDefaultAllocator(context);
  ::vk::createCommandPool
            (&local_a8,(DeviceInterface *)vk_00,device_00,2,dVar3,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data_00.object.m_internal = local_88.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_88.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_88.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_88.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_88.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_a8);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_68);
  makeCommandBuffer(&local_118,(DeviceInterface *)vk_00,device_00,(VkCommandPool)pHVar5->m_internal)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data_01.object = local_f8.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_f8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_f8.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_f8.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_d8,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_118);
  VVar6 = ::vk::makeOffset2D(0,0);
  dVar3 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  dVar4 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  VVar7 = ::vk::makeExtent2D(dVar3,dVar4);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)&attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )local_160);
  for (local_164 = 0; local_164 < caseDef->numLayers; local_164 = local_164 + 1) {
    format = caseDef->colorFormat;
    makeColorSubresourceRange
              ((VkImageSubresourceRange *)
               &vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_164,1);
    subresourceRange.levelCount = (int)uStack_1b0;
    subresourceRange._0_8_ =
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    subresourceRange.baseArrayLayer = (int)((ulong)uStack_1b0 >> 0x20);
    subresourceRange.layerCount = local_1a8;
    makeImageView(&local_198,(DeviceInterface *)vk_00,device_00,colorImage,VK_IMAGE_VIEW_TYPE_2D,
                  format,subresourceRange);
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((_anonymous_namespace_ *)&local_178,&local_198);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 *)&attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_178);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_178);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_198);
    this_00 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                      *)&attachmentHandles.
                         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (this_00)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    __x = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(this_01);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *)local_160,__x);
  }
  genTriangleVertices();
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       sizeInBytes<vkt::pipeline::Vertex4RGBA>
                 ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )&vertexBufferSize);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,(DeviceInterface *)vk_00,device_00,
             (VkDeviceSize)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
             0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_218,
             (Move *)&vertexBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar19 = (undefined4)local_218.object.m_internal;
  uVar20 = (undefined4)(local_218.object.m_internal >> 0x20);
  uVar21 = SUB84(local_218.deleter.m_deviceIface,0);
  uVar22 = (undefined4)((ulong)local_218.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_deviceIface._0_4_ = uVar21;
  data_02.object.m_internal = local_218.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = uVar22;
  data_02.deleter.m_device._0_4_ = (int)local_218.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_218.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_218.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_218.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_1f8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  allocator_00 = cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1f8);
  this_04 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_268,
             (DeviceInterface *)vk_00,device_00,(Allocator *)allocator_00,
             (VkBuffer)pHVar8->m_internal,::vk::MemoryRequirement::HostVisible);
  local_258 = de::details::MovePtr::operator_cast_to_PtrData(&local_268,this_04);
  data.ptr._4_4_ = uVar20;
  data.ptr._0_4_ = uVar19;
  data._8_4_ = uVar21;
  data._12_4_ = uVar22;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_248,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_268);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_248);
  dst = ::vk::Allocation::getHostPtr(pAVar9);
  src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)&vertexBufferSize,0);
  ::deMemcpy(dst,src,(size_t)vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                             deleter.m_allocator);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_248);
  vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar9);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_248);
  offset = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,
             (VkDeviceMemory)
             vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             offset,(VkDeviceSize)
                    vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                    m_allocator);
  pPVar10 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"vert",
             (allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar10,&local_300);
  ::vk::createShaderModule(&local_2e0,(DeviceInterface *)vk_00,device_00,pPVar11,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c0,(Move *)&local_2e0);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_2c0.deleter.m_deviceIface;
  data_03.object.m_internal = local_2c0.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c0.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_2c0.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_2c0.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_2c0.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_2c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2a0,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar10 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"frag",
             (allocator<char> *)
             ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar10,&local_388);
  ::vk::createShaderModule(&local_368,(DeviceInterface *)vk_00,device_00,pPVar11,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_348,(Move *)&local_368);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_348.deleter.m_deviceIface;
  data_04.object.m_internal = local_348.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_348.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_348.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_348.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_348.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_348.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_328,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator + 7));
  makeMultisampleRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             (DeviceInterface *)vk_00,device_00,caseDef->colorFormat,caseDef->numSamples,
             caseDef->numLayers);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3d0,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_3d0.deleter.m_deviceIface;
  data_05.object.m_internal = local_3d0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3d0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_3d0.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_3d0.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_3d0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_3d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3b0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3b0);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar12->m_internal;
  dVar3 = caseDef->numLayers;
  pAttachments = std::
                 vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                               *)local_160,0);
  dVar4 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
  height = tcu::Vector<int,_2>::y(&caseDef->renderSize);
  makeFramebuffer(&local_450,(DeviceInterface *)vk_00,device_00,
                  (VkRenderPass)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,dVar3,pAttachments,dVar4,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_430,(Move *)&local_450);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_430.deleter.m_deviceIface;
  data_06.object.m_internal = local_430.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_430.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_430.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_430.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_430.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_430.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_410,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_450);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                     &pipelines.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk_00,
                     device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_498,
             (Move *)&pipelines.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_07.object.m_internal = local_498.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_498.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_498.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_498.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_498.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_478,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &pipelines.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dVar3 = caseDef->numLayers;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_478);
  pipelineLayout_00.m_internal = pHVar13->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3b0);
  renderPass_00.m_internal = pHVar12->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_2a0);
  vertexModule_00.m_internal = pHVar14->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_328);
  fragmentModule_00.m_internal = pHVar14->m_internal;
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)
             &clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&caseDef->renderSize);
  makeGraphicsPipelines
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              *)local_4d0,(DeviceInterface *)vk_00,device_00,dVar3,pipelineLayout_00,renderPass_00,
             vertexModule_00,fragmentModule_00,
             (IVec2 *)&clearValues.
                       super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,caseDef->numSamples,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar15);
  iVar1 = caseDef->numLayers;
  local_520 = getClearValue(caseDef->colorFormat);
  this = (allocator<vk::VkClearValue> *)((long)&renderPassBeginInfo.pClearValues + 7);
  std::allocator<vk::VkClearValue>::allocator(this);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_510,(long)iVar1,
             &local_520,this);
  std::allocator<vk::VkClearValue>::~allocator
            ((allocator<vk::VkClearValue> *)((long)&renderPassBeginInfo.pClearValues + 7));
  vertexBufferOffset._0_4_ = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3b0);
  renderPassBeginInfo.pNext = (void *)pHVar12->m_internal;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_410);
  renderPassBeginInfo.renderPass.m_internal = pHVar16->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)VVar6;
  renderPassBeginInfo.renderArea.offset = (VkOffset2D)VVar7;
  sVar17 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                     ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_510);
  renderPassBeginInfo.renderArea.extent.width = (deUint32)sVar17;
  renderPassBeginInfo._48_8_ =
       std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                 ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_510,0);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  (*(*(_func_int ***)vk_00)[0x74])(vk_00,*ppVVar15,&vertexBufferOffset,0);
  uStack_570 = 0;
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  pVVar2 = *ppVVar15;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1f8);
  (*(*(_func_int ***)vk_00)[0x58])(vk_00,pVVar2,0,1,pHVar8,&stack0xfffffffffffffa90);
  for (local_574 = 0; local_574 < caseDef->numLayers; local_574 = local_574 + 1) {
    if (local_574 != 0) {
      ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
      (*(*(_func_int ***)vk_00)[0x75])(vk_00,*ppVVar15,0);
    }
    ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
    pVVar2 = *ppVVar15;
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            *)local_4d0,(long)local_574);
    this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (this_02)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(this_03);
    (*(*(_func_int ***)vk_00)[0x4c])(vk_00,pVVar2,0,pHVar18->m_internal);
    ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
    pVVar2 = *ppVVar15;
    sVar17 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )&vertexBufferSize);
    (*(*(_func_int ***)vk_00)[0x59])(vk_00,pVVar2,sVar17 & 0xffffffff,1,0);
  }
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  (*(*(_func_int ***)vk_00)[0x76])(vk_00,*ppVVar15);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  result = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar15);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x34d);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_d8);
  submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar15);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_510);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)local_4d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_478);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_410);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_328);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2a0);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_248);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_1f8);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             &vertexBufferSize);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)local_160);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)&attachmentHandles.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_68);
  return;
}

Assistant:

void renderMultisampledImage (Context& context, const CaseDef& caseDef, const VkImage colorImage)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	{
		// Create an image view (attachment) for each layer of the image
		std::vector<ImageViewSp>	colorAttachments;
		std::vector<VkImageView>	attachmentHandles;
		for (int i = 0; i < caseDef.numLayers; ++i)
		{
			colorAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, colorImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.colorFormat, makeColorSubresourceRange(i, 1))));
			attachmentHandles.push_back(**colorAttachments.back());
		}

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genTriangleVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		const Unique<VkShaderModule>	vertexModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeMultisampleRenderPass	(vk, device, caseDef.colorFormat, caseDef.numSamples, caseDef.numLayers));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer			(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
																					 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout			(vk, device));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines		(vk, device, caseDef.numLayers, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																					 caseDef.renderSize, caseDef.numSamples, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST));

		beginCommandBuffer(vk, *cmdBuffer);

		const std::vector<VkClearValue> clearValues(caseDef.numLayers, getClearValue(caseDef.colorFormat));

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*renderPass,									// VkRenderPass            renderPass;
			*framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			static_cast<deUint32>(clearValues.size()),		// uint32_t                clearValueCount;
			&clearValues[0],								// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		for (int layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
		{
			if (layerNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[layerNdx]);

			vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}
}